

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O3

RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  RK_U32 RVar2;
  undefined8 in_RAX;
  char *fmt;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = frm->val;
  uVar3 = uVar1 >> 0x30;
  if (((uint)uVar1 & 0x41) == 1) {
    if ((char)uVar1 < '\0') {
      lVar5 = 0;
      do {
        if (((cpb->cpb_refs[lVar5 + 0x10].val & 1) != 0) &&
           ((((uint)cpb->cpb_refs[lVar5 + 0x10].val ^ (uint)uVar1) & 0xf00) == 0)) {
          uVar4 = lVar5 + 0x10;
          if ((enc_refs_debug & 2) == 0) goto LAB_0014cdfc;
          fmt = "found ltr ref %d at pos %d\n";
          goto LAB_0014cde3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
    }
    else {
      uVar4 = 0;
      RVar2 = enc_refs_debug;
      do {
        if ((RVar2 & 2) != 0) {
          in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                            (uint)*(ushort *)((long)cpb->cpb_refs + uVar4 * 8 + 6));
          _mpp_log_l(4,"mpp_enc_refs","matching ref %d at pos %d %d\n","check_ref_cpb_pos",uVar3,
                     uVar4 & 0xffffffff,in_RAX);
          RVar2 = enc_refs_debug;
        }
        if ((short)(cpb->cpb_refs[uVar4].val >> 0x30) == (short)(uVar1 >> 0x30) &&
            (cpb->cpb_refs[uVar4].val & 1) != 0) {
          if ((RVar2 & 2) != 0) {
            fmt = "found ref %d at pos %d\n";
LAB_0014cde3:
            _mpp_log_l(4,"mpp_enc_refs",fmt,"check_ref_cpb_pos",uVar3,uVar4 & 0xffffffff);
          }
          goto LAB_0014cdfc;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x10);
    }
    _mpp_log_l(2,"mpp_enc_refs","frm %d can NOT be found in st refs!!\n","check_ref_cpb_pos",uVar3);
    _dump_cpb(cpb,"check_ref_cpb_pos",0x1be);
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0xffffffff;
    if ((enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm %d is not valid ref frm\n","check_ref_cpb_pos",uVar3);
    }
  }
LAB_0014cdfc:
  return (RK_S32)uVar4;
}

Assistant:

static RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 found = 0;
    RK_S32 pos = -1;

    if (!frm->valid || frm->is_non_ref) {
        enc_refs_dbg_flow("frm %d is not valid ref frm\n", seq_idx);
        return pos;
    }

    if (frm->is_lt_ref) {
        /* find same lt_idx */
        for (pos = 0; pos < MAX_CPB_LT_FRM; pos++) {
            RK_S32 cpb_idx = pos + MAX_CPB_ST_FRM;
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (cpb_ref->valid && cpb_ref->lt_idx == frm->lt_idx) {
                pos = cpb_idx;
                enc_refs_dbg_flow("found ltr ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    } else {
        /* search seq_idx in cpb to check the st cpb size */
        for (pos = 0; pos < MAX_CPB_ST_FRM; pos++) {
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[pos];

            enc_refs_dbg_flow("matching ref %d at pos %d %d\n",
                              seq_idx, pos, cpb_ref->seq_idx);

            if (cpb_ref->valid && cpb_ref->seq_idx == seq_idx) {
                enc_refs_dbg_flow("found ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    }

    if (!found) {
        mpp_err_f("frm %d can NOT be found in st refs!!\n", seq_idx);
        pos = -1;
        dump_cpb(cpb);
    }

    return pos;
}